

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_url_encode(char *src,size_t s_len,char *dst,size_t dst_len)

{
  ushort **ppuVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  
  if (s_len == 0 || dst_len == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 1;
    while (uVar3 + 2 < dst_len - 1) {
      ppuVar1 = __ctype_b_loc();
      bVar5 = src[uVar4 - 1];
      if ((((*ppuVar1)[bVar5] & 8) == 0) &&
         (pvVar2 = memchr("._-$,;~()",(uint)bVar5,10), pvVar2 == (void *)0x0)) {
        if (uVar3 + 3 < dst_len) {
          dst[uVar3] = '%';
          dst[uVar3 + 1] = "0123456789abcdef"[(byte)src[uVar4 - 1] >> 4];
          bVar5 = "0123456789abcdef"[(byte)src[uVar4 - 1] & 0xf];
          uVar3 = uVar3 + 2;
          goto LAB_00106cc6;
        }
      }
      else {
LAB_00106cc6:
        dst[uVar3] = bVar5;
      }
      uVar3 = uVar3 + 1;
      if ((dst_len == 0) || (bVar6 = s_len <= uVar4, uVar4 = uVar4 + 1, bVar6)) break;
    }
  }
  dst[uVar3] = '\0';
  return (int)uVar3;
}

Assistant:

int mg_url_encode(const char *src, size_t s_len, char *dst, size_t dst_len) {
  static const char *dont_escape = "._-$,;~()";
  static const char *hex = "0123456789abcdef";
  size_t i = 0, j = 0;

  for (i = j = 0; dst_len > 0 && i < s_len && j + 2 < dst_len - 1; i++, j++) {
    if (isalnum(* (const unsigned char *) (src + i)) ||
        strchr(dont_escape, * (const unsigned char *) (src + i)) != NULL) {
      dst[j] = src[i];
    } else if (j + 3 < dst_len) {
      dst[j] = '%';
      dst[j + 1] = hex[(* (const unsigned char *) (src + i)) >> 4];
      dst[j + 2] = hex[(* (const unsigned char *) (src + i)) & 0xf];
      j += 2;
    }
  }

  dst[j] = '\0';
  return j;
}